

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_fillreadbuffer(connectdata *conn,size_t bytes,size_t *nreadp)

{
  long lVar1;
  bool bVar2;
  char **ppcVar3;
  int iVar4;
  Curl_send_buffer *pCVar5;
  size_t sVar6;
  size_t sVar7;
  int local_94;
  char *pcStack_90;
  int hexlen;
  char *endofline_network;
  char *endofline_native;
  char hexbuffer [11];
  SingleRequest *k;
  size_t sStack_60;
  _Bool added_crlf;
  void *extra_data;
  curl_read_callback readfunc;
  int trailers_ret_code;
  CURLcode c;
  curl_slist *trailers;
  size_t nread;
  size_t buffersize;
  Curl_easy *data;
  size_t *nreadp_local;
  size_t bytes_local;
  connectdata *conn_local;
  
  buffersize = (size_t)conn->data;
  _trailers_ret_code = (curl_slist *)0x0;
  bVar2 = false;
  nread = bytes;
  data = (Curl_easy *)nreadp;
  nreadp_local = (size_t *)bytes;
  bytes_local = (size_t)conn;
  if ((((Curl_easy *)buffersize)->state).trailers_state == TRAILERS_INITIALIZED) {
    Curl_infof((Curl_easy *)buffersize,
               "Moving trailers state machine from initialized to sending.\n");
    *(undefined4 *)(buffersize + 0x1678) = 2;
    pCVar5 = Curl_add_buffer_init();
    *(Curl_send_buffer **)(buffersize + 0x1670) = pCVar5;
    if (*(long *)(buffersize + 0x1670) == 0) {
      Curl_failf((Curl_easy *)buffersize,"Unable to allocate trailing headers buffer !");
      return CURLE_OUT_OF_MEMORY;
    }
    *(undefined8 *)(buffersize + 0x1668) = 0;
    Curl_set_in_callback((Curl_easy *)buffersize,true);
    iVar4 = (**(code **)(buffersize + 0xfb0))(&trailers_ret_code);
    Curl_set_in_callback((Curl_easy *)buffersize,false);
    if (iVar4 == 0) {
      readfunc._4_4_ =
           Curl_http_compile_trailers
                     (_trailers_ret_code,*(Curl_send_buffer **)(buffersize + 0x1670),
                      (Curl_easy *)buffersize);
    }
    else {
      Curl_failf((Curl_easy *)buffersize,"operation aborted by trailing headers callback");
      data->next = (Curl_easy *)0x0;
      readfunc._4_4_ = CURLE_ABORTED_BY_CALLBACK;
    }
    if (readfunc._4_4_ != CURLE_OK) {
      Curl_add_buffer_free((Curl_send_buffer **)(buffersize + 0x1670));
      curl_slist_free_all(_trailers_ret_code);
      return readfunc._4_4_;
    }
    Curl_infof((Curl_easy *)buffersize,"Successfully compiled trailers.\r\n");
    curl_slist_free_all(_trailers_ret_code);
  }
  if (((*(byte *)(buffersize + 0x211) & 1) != 0) && (*(int *)(buffersize + 0x1678) == 0)) {
    nread = nread - 0xc;
    *(long *)(buffersize + 0x208) = *(long *)(buffersize + 0x208) + 10;
  }
  if (*(int *)(buffersize + 0x1678) == 2) {
    extra_data = Curl_trailers_read;
    sStack_60 = buffersize;
  }
  else {
    extra_data = *(void **)(buffersize + 0x1600);
    sStack_60 = *(size_t *)(buffersize + 0x1608);
  }
  Curl_set_in_callback((Curl_easy *)buffersize,true);
  trailers = (curl_slist *)
             (*(code *)extra_data)(*(undefined8 *)(buffersize + 0x208),1,nread,sStack_60);
  Curl_set_in_callback((Curl_easy *)buffersize,false);
  if (trailers == (curl_slist *)0x10000000) {
    Curl_failf((Curl_easy *)buffersize,"operation aborted by callback");
    data->next = (Curl_easy *)0x0;
    conn_local._4_4_ = CURLE_ABORTED_BY_CALLBACK;
  }
  else if (trailers == (curl_slist *)0x10000001) {
    hexbuffer._3_8_ = buffersize + 0xf0;
    if ((*(uint *)(*(long *)(bytes_local + 0x3e0) + 0x84) & 0x10) == 0) {
      *(uint *)(buffersize + 0x1e4) = *(uint *)(buffersize + 0x1e4) | 0x20;
      if ((*(byte *)(buffersize + 0x211) & 1) != 0) {
        *(long *)(buffersize + 0x208) = *(long *)(buffersize + 0x208) + -10;
      }
      data->next = (Curl_easy *)0x0;
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_failf((Curl_easy *)buffersize,"Read callback asked for PAUSE when not supported!");
      conn_local._4_4_ = CURLE_READ_ERROR;
    }
  }
  else if (nread < trailers) {
    data->next = (Curl_easy *)0x0;
    Curl_failf((Curl_easy *)buffersize,"read function returned funny value");
    conn_local._4_4_ = CURLE_READ_ERROR;
  }
  else {
    if (((*(byte *)(buffersize + 0x213) & 1) == 0) && ((*(byte *)(buffersize + 0x211) & 1) != 0)) {
      local_94 = 0;
      if (((*(byte *)(buffersize + 0xc4b) & 1) == 0) && ((*(byte *)(buffersize + 0xa12) & 1) == 0))
      {
        endofline_network = "\r\n";
        pcStack_90 = "\r\n";
      }
      else {
        endofline_network = "\n";
        pcStack_90 = "\n";
      }
      if (*(int *)(buffersize + 0x1678) != 2) {
        local_94 = curl_msnprintf((char *)((long)&endofline_native + 5),0xb,"%zx%s",trailers,
                                  endofline_network);
        *(long *)(buffersize + 0x208) = *(long *)(buffersize + 0x208) - (long)local_94;
        trailers = (curl_slist *)((long)&trailers->data + (long)local_94);
        memcpy(*(void **)(buffersize + 0x208),(void *)((long)&endofline_native + 5),(long)local_94);
        if (((trailers == (curl_slist *)(long)local_94) && (*(long *)(buffersize + 0xfb0) != 0)) &&
           (*(int *)(buffersize + 0x1678) == 0)) {
          *(undefined4 *)(buffersize + 0x1678) = 1;
        }
        else {
          lVar1 = *(long *)(buffersize + 0x208);
          ppcVar3 = &trailers->data;
          sVar7 = strlen(pcStack_90);
          memcpy((void *)((long)ppcVar3 + lVar1),pcStack_90,sVar7);
          bVar2 = true;
        }
      }
      if ((*(int *)(buffersize + 0x1678) == 2) &&
         (sVar6 = Curl_trailers_left((void *)buffersize), sVar6 == 0)) {
        Curl_add_buffer_free((Curl_send_buffer **)(buffersize + 0x1670));
        *(undefined4 *)(buffersize + 0x1678) = 3;
        *(undefined8 *)(buffersize + 0xfa8) = 0;
        *(undefined8 *)(buffersize + 0xfb0) = 0;
        *(undefined1 *)(buffersize + 0x1e8) = 1;
        Curl_infof((Curl_easy *)buffersize,"Signaling end of chunked upload after trailers.\n");
      }
      else if ((trailers == (curl_slist *)(long)local_94) && (*(int *)(buffersize + 0x1678) != 1)) {
        *(undefined1 *)(buffersize + 0x1e8) = 1;
        Curl_infof((Curl_easy *)buffersize,
                   "Signaling end of chunked upload via terminating chunk.\n");
      }
      if (bVar2) {
        sVar7 = strlen(pcStack_90);
        trailers = (curl_slist *)((long)&trailers->data + sVar7);
      }
    }
    data->next = (Curl_easy *)trailers;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_fillreadbuffer(struct connectdata *conn, size_t bytes,
                             size_t *nreadp)
{
  struct Curl_easy *data = conn->data;
  size_t buffersize = bytes;
  size_t nread;

#ifndef CURL_DISABLE_HTTP
  struct curl_slist *trailers = NULL;
  CURLcode c;
  int trailers_ret_code;
#endif

  curl_read_callback readfunc = NULL;
  void *extra_data = NULL;
  bool added_crlf = FALSE;

#ifdef CURL_DOES_CONVERSIONS
  bool sending_http_headers = FALSE;

  if(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)) {
    const struct HTTP *http = data->req.protop;

    if(http->sending == HTTPSEND_REQUEST)
      /* We're sending the HTTP request headers, not the data.
         Remember that so we don't re-translate them into garbage. */
      sending_http_headers = TRUE;
  }
#endif

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_INITIALIZED) {
    /* at this point we already verified that the callback exists
       so we compile and store the trailers buffer, then proceed */
    infof(data,
          "Moving trailers state machine from initialized to sending.\n");
    data->state.trailers_state = TRAILERS_SENDING;
    data->state.trailers_buf = Curl_add_buffer_init();
    if(!data->state.trailers_buf) {
      failf(data, "Unable to allocate trailing headers buffer !");
      return CURLE_OUT_OF_MEMORY;
    }
    data->state.trailers_bytes_sent = 0;
    Curl_set_in_callback(data, true);
    trailers_ret_code = data->set.trailer_callback(&trailers,
                                                   data->set.trailer_data);
    Curl_set_in_callback(data, false);
    if(trailers_ret_code == CURL_TRAILERFUNC_OK) {
      c = Curl_http_compile_trailers(trailers, data->state.trailers_buf, data);
    }
    else {
      failf(data, "operation aborted by trailing headers callback");
      *nreadp = 0;
      c = CURLE_ABORTED_BY_CALLBACK;
    }
    if(c != CURLE_OK) {
      Curl_add_buffer_free(&data->state.trailers_buf);
      curl_slist_free_all(trailers);
      return c;
    }
    infof(data, "Successfully compiled trailers.\r\n");
    curl_slist_free_all(trailers);
  }
#endif

  /* if we are transmitting trailing data, we don't need to write
     a chunk size so we skip this */
  if(data->req.upload_chunky &&
     data->state.trailers_state == TRAILERS_NONE) {
    /* if chunked Transfer-Encoding */
    buffersize -= (8 + 2 + 2);   /* 32bit hex + CRLF + CRLF */
    data->req.upload_fromhere += (8 + 2); /* 32bit hex + CRLF */
  }

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_SENDING) {
    /* if we're here then that means that we already sent the last empty chunk
       but we didn't send a final CR LF, so we sent 0 CR LF. We then start
       pulling trailing data until we ²have no more at which point we
       simply return to the previous point in the state machine as if
       nothing happened.
       */
    readfunc = Curl_trailers_read;
    extra_data = (void *)data;
  }
  else
#endif
  {
    readfunc = data->state.fread_func;
    extra_data = data->state.in;
  }

  Curl_set_in_callback(data, true);
  nread = readfunc(data->req.upload_fromhere, 1,
                   buffersize, extra_data);
  Curl_set_in_callback(data, false);

  if(nread == CURL_READFUNC_ABORT) {
    failf(data, "operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if(nread == CURL_READFUNC_PAUSE) {
    struct SingleRequest *k = &data->req;

    if(conn->handler->flags & PROTOPT_NONETWORK) {
      /* protocols that work without network cannot be paused. This is
         actually only FILE:// just now, and it can't pause since the transfer
         isn't done using the "normal" procedure. */
      failf(data, "Read callback asked for PAUSE when not supported!");
      return CURLE_READ_ERROR;
    }

    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    k->keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    if(data->req.upload_chunky) {
        /* Back out the preallocation done above */
      data->req.upload_fromhere -= (8 + 2);
    }
    *nreadp = 0;

    return CURLE_OK; /* nothing was read */
  }
  else if(nread > buffersize) {
    /* the read function returned a too large value */
    *nreadp = 0;
    failf(data, "read function returned funny value");
    return CURLE_READ_ERROR;
  }

  if(!data->req.forbidchunk && data->req.upload_chunky) {
    /* if chunked Transfer-Encoding
     *    build chunk:
     *
     *        <HEX SIZE> CRLF
     *        <DATA> CRLF
     */
    /* On non-ASCII platforms the <DATA> may or may not be
       translated based on set.prefer_ascii while the protocol
       portion must always be translated to the network encoding.
       To further complicate matters, line end conversion might be
       done later on, so we need to prevent CRLFs from becoming
       CRCRLFs if that's the case.  To do this we use bare LFs
       here, knowing they'll become CRLFs later on.
     */

    char hexbuffer[11];
    const char *endofline_native;
    const char *endofline_network;
    int hexlen = 0;

    if(
#ifdef CURL_DO_LINEEND_CONV
       (data->set.prefer_ascii) ||
#endif
       (data->set.crlf)) {
      /* \n will become \r\n later on */
      endofline_native  = "\n";
      endofline_network = "\x0a";
    }
    else {
      endofline_native  = "\r\n";
      endofline_network = "\x0d\x0a";
    }

    /* if we're not handling trailing data, proceed as usual */
    if(data->state.trailers_state != TRAILERS_SENDING) {
      hexlen = msnprintf(hexbuffer, sizeof(hexbuffer),
                         "%zx%s", nread, endofline_native);

      /* move buffer pointer */
      data->req.upload_fromhere -= hexlen;
      nread += hexlen;

      /* copy the prefix to the buffer, leaving out the NUL */
      memcpy(data->req.upload_fromhere, hexbuffer, hexlen);

      /* always append ASCII CRLF to the data unless
         we have a valid trailer callback */
#ifndef CURL_DISABLE_HTTP
      if((nread-hexlen) == 0 &&
          data->set.trailer_callback != NULL &&
          data->state.trailers_state == TRAILERS_NONE) {
        data->state.trailers_state = TRAILERS_INITIALIZED;
      }
      else
#endif
      {
        memcpy(data->req.upload_fromhere + nread,
               endofline_network,
               strlen(endofline_network));
        added_crlf = TRUE;
      }
    }

#ifdef CURL_DOES_CONVERSIONS
    {
      CURLcode result;
      size_t length;
      if(data->set.prefer_ascii)
        /* translate the protocol and data */
        length = nread;
      else
        /* just translate the protocol portion */
        length = strlen(hexbuffer);
      result = Curl_convert_to_network(data, data->req.upload_fromhere,
                                       length);
      /* Curl_convert_to_network calls failf if unsuccessful */
      if(result)
        return result;
    }
#endif /* CURL_DOES_CONVERSIONS */

#ifndef CURL_DISABLE_HTTP
    if(data->state.trailers_state == TRAILERS_SENDING &&
       !Curl_trailers_left(data)) {
      Curl_add_buffer_free(&data->state.trailers_buf);
      data->state.trailers_state = TRAILERS_DONE;
      data->set.trailer_data = NULL;
      data->set.trailer_callback = NULL;
      /* mark the transfer as done */
      data->req.upload_done = TRUE;
      infof(data, "Signaling end of chunked upload after trailers.\n");
    }
    else
#endif
      if((nread - hexlen) == 0 &&
         data->state.trailers_state != TRAILERS_INITIALIZED) {
        /* mark this as done once this chunk is transferred */
        data->req.upload_done = TRUE;
        infof(data,
              "Signaling end of chunked upload via terminating chunk.\n");
      }

    if(added_crlf)
      nread += strlen(endofline_network); /* for the added end of line */
  }
#ifdef CURL_DOES_CONVERSIONS
  else if((data->set.prefer_ascii) && (!sending_http_headers)) {
    CURLcode result;
    result = Curl_convert_to_network(data, data->req.upload_fromhere, nread);
    /* Curl_convert_to_network calls failf if unsuccessful */
    if(result)
      return result;
  }
#endif /* CURL_DOES_CONVERSIONS */

  *nreadp = nread;

  return CURLE_OK;
}